

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::reset(raw_quasi_adaptive_huffman_data_model *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  int iVar35;
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar39 [16];
  long lVar14;
  
  auVar5 = _DAT_0011f070;
  uVar1 = this->m_total_syms;
  uVar7 = (ulong)uVar1;
  bVar8 = true;
  if (uVar7 != 0) {
    puVar2 = (this->m_sym_freq).m_p;
    lVar14 = uVar7 - 1;
    auVar10._8_4_ = (int)lVar14;
    auVar10._0_8_ = lVar14;
    auVar10._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_0011f070;
    auVar13 = _DAT_0011fbd0;
    auVar15 = _DAT_0011fbe0;
    auVar16 = _DAT_0011f050;
    auVar17 = _DAT_0011f060;
    do {
      auVar18 = auVar17 ^ auVar5;
      iVar32 = auVar10._0_4_;
      iVar31 = -(uint)(iVar32 < auVar18._0_4_);
      iVar11 = auVar10._4_4_;
      auVar19._4_4_ = -(uint)(iVar11 < auVar18._4_4_);
      iVar36 = auVar10._8_4_;
      iVar35 = -(uint)(iVar36 < auVar18._8_4_);
      iVar12 = auVar10._12_4_;
      auVar19._12_4_ = -(uint)(iVar12 < auVar18._12_4_);
      auVar28._4_4_ = iVar31;
      auVar28._0_4_ = iVar31;
      auVar28._8_4_ = iVar35;
      auVar28._12_4_ = iVar35;
      auVar37 = pshuflw(in_XMM11,auVar28,0xe8);
      auVar21._4_4_ = -(uint)(auVar18._4_4_ == iVar11);
      auVar21._12_4_ = -(uint)(auVar18._12_4_ == iVar12);
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      auVar39 = pshuflw(in_XMM12,auVar21,0xe8);
      auVar19._0_4_ = auVar19._4_4_;
      auVar19._8_4_ = auVar19._12_4_;
      auVar38 = pshuflw(auVar37,auVar19,0xe8);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar38 | auVar39 & auVar37) ^ auVar18;
      auVar18 = packssdw(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9) = 1;
      }
      auVar19 = auVar21 & auVar28 | auVar19;
      auVar18 = packssdw(auVar19,auVar19);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar38,auVar18 ^ auVar38);
      if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 2) = 1;
      }
      auVar18 = auVar16 ^ auVar5;
      iVar31 = -(uint)(iVar32 < auVar18._0_4_);
      auVar33._4_4_ = -(uint)(iVar11 < auVar18._4_4_);
      iVar35 = -(uint)(iVar36 < auVar18._8_4_);
      auVar33._12_4_ = -(uint)(iVar12 < auVar18._12_4_);
      auVar20._4_4_ = iVar31;
      auVar20._0_4_ = iVar31;
      auVar20._8_4_ = iVar35;
      auVar20._12_4_ = iVar35;
      auVar27._4_4_ = -(uint)(auVar18._4_4_ == iVar11);
      auVar27._12_4_ = -(uint)(auVar18._12_4_ == iVar12);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar18 = auVar27 & auVar20 | auVar33;
      auVar18 = packssdw(auVar18,auVar18);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar3,auVar18 ^ auVar3);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 4) = 1;
      }
      auVar21 = pshufhw(auVar20,auVar20,0x84);
      auVar28 = pshufhw(auVar27,auVar27,0x84);
      auVar19 = pshufhw(auVar21,auVar33,0x84);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar19 | auVar28 & auVar21) ^ auVar22;
      auVar21 = packssdw(auVar22,auVar22);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 6) = 1;
      }
      auVar21 = auVar15 ^ auVar5;
      iVar31 = -(uint)(iVar32 < auVar21._0_4_);
      auVar24._4_4_ = -(uint)(iVar11 < auVar21._4_4_);
      iVar35 = -(uint)(iVar36 < auVar21._8_4_);
      auVar24._12_4_ = -(uint)(iVar12 < auVar21._12_4_);
      auVar29._4_4_ = iVar31;
      auVar29._0_4_ = iVar31;
      auVar29._8_4_ = iVar35;
      auVar29._12_4_ = iVar35;
      auVar18 = pshuflw(auVar18,auVar29,0xe8);
      auVar23._4_4_ = -(uint)(auVar21._4_4_ == iVar11);
      auVar23._12_4_ = -(uint)(auVar21._12_4_ == iVar12);
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar21 = pshuflw(auVar39 & auVar37,auVar23,0xe8);
      in_XMM12 = auVar21 & auVar18;
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar18 = pshuflw(auVar18,auVar24,0xe8);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar18 | in_XMM12) ^ auVar37;
      auVar18 = packssdw(auVar37,auVar37);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 8) = 1;
      }
      auVar24 = auVar23 & auVar29 | auVar24;
      auVar18 = packssdw(auVar24,auVar24);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar39,auVar18 ^ auVar39);
      if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 10) = 1;
      }
      auVar18 = auVar13 ^ auVar5;
      iVar32 = -(uint)(iVar32 < auVar18._0_4_);
      auVar34._4_4_ = -(uint)(iVar11 < auVar18._4_4_);
      iVar36 = -(uint)(iVar36 < auVar18._8_4_);
      auVar34._12_4_ = -(uint)(iVar12 < auVar18._12_4_);
      auVar25._4_4_ = iVar32;
      auVar25._0_4_ = iVar32;
      auVar25._8_4_ = iVar36;
      auVar25._12_4_ = iVar36;
      auVar30._4_4_ = -(uint)(auVar18._4_4_ == iVar11);
      auVar30._12_4_ = -(uint)(auVar18._12_4_ == iVar12);
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar18 = auVar30 & auVar25 | auVar34;
      auVar18 = packssdw(auVar18,auVar18);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar18 ^ auVar4,auVar18 ^ auVar4);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 0xc) = 1;
      }
      auVar18 = pshufhw(auVar25,auVar25,0x84);
      auVar19 = pshufhw(auVar30,auVar30,0x84);
      auVar21 = pshufhw(auVar18,auVar34,0x84);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar26 = (auVar21 | auVar19 & auVar18) ^ auVar26;
      auVar18 = packssdw(auVar26,auVar26);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)puVar2 + uVar9 + 0xe) = 1;
      }
      lVar14 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 8;
      auVar17._8_8_ = lVar14 + 8;
      lVar14 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar14 + 8;
      lVar14 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar14 + 8;
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar14 + 8;
      uVar9 = uVar9 + 0x10;
    } while ((uVar7 * 2 + 0xe & 0xfffffffffffffff0) != uVar9);
    this->m_total_count = 0;
    this->m_update_cycle = uVar1;
    bVar6 = update(this);
    if (bVar6) {
      this->m_update_cycle = 8;
      this->m_symbols_until_update = 8;
    }
    else {
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::reset()
   {
      if (!m_total_syms)
         return true;

      for (uint i = 0; i < m_total_syms; i++)
         m_sym_freq[i] = 1;

      m_total_count = 0;
      m_update_cycle = m_total_syms;

      if (!update())
         return false;

      m_symbols_until_update = m_update_cycle = 8;
      return true;
   }